

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxid.h
# Opt level: O1

void __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::left4(SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *this,int n,SPxId id)

{
  cpp_dec_float<50U,_int,_void> *pcVar1;
  uint *puVar2;
  int iVar3;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar4;
  UpdateVector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pUVar5;
  undefined8 uVar6;
  pointer pnVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  cpp_dec_float<50U,_int,_void> uu;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rhov_1;
  cpp_dec_float<50U,_int,_void> local_178;
  cpp_dec_float<50U,_int,_void> local_138;
  long local_f8;
  pointer local_f0;
  cpp_dec_float<50U,_int,_void> local_e8;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (id.super_DataKey.info != 0) {
    pSVar4 = (this->
             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    local_e8.fpclass = cpp_dec_float_finite;
    local_e8.prec_elem = 10;
    local_e8.data._M_elems[0] = 0;
    local_e8.data._M_elems[1] = 0;
    local_e8.data._M_elems[2] = 0;
    local_e8.data._M_elems[3] = 0;
    local_e8.data._M_elems[4] = 0;
    local_e8.data._M_elems[5] = 0;
    local_e8.data._M_elems._24_5_ = 0;
    local_e8.data._M_elems[7]._1_3_ = 0;
    local_e8.data._M_elems._32_5_ = 0;
    local_e8.data._M_elems[9]._1_3_ = 0;
    local_e8.exp = 0;
    local_e8.neg = false;
    local_f0 = (pSVar4->theFvec->thedelta).
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_f8 = (long)n * 0x38;
    pcVar1 = &local_f0[n].m_backend;
    local_68.fpclass = cpp_dec_float_finite;
    local_68.prec_elem = 10;
    local_68.data._M_elems[0] = 0;
    local_68.data._M_elems[1] = 0;
    local_68.data._M_elems[2] = 0;
    local_68.data._M_elems[3] = 0;
    local_68.data._M_elems[4] = 0;
    local_68.data._M_elems[5] = 0;
    local_68.data._M_elems._24_5_ = 0;
    local_68.data._M_elems[7]._1_3_ = 0;
    local_68.data._M_elems._32_5_ = 0;
    local_68._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&local_a8,1,(type *)0x0);
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&local_68,&local_a8,pcVar1);
    SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::length2((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_178,
              &((this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver)->theCoPvec->thedelta);
    local_138.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
    local_138.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
    local_138.data._M_elems[0] = local_178.data._M_elems[0];
    local_138.data._M_elems[1] = local_178.data._M_elems[1];
    local_138.data._M_elems[2] = local_178.data._M_elems[2];
    local_138.data._M_elems[3] = local_178.data._M_elems[3];
    local_138.data._M_elems[4] = local_178.data._M_elems[4];
    local_138.data._M_elems[5] = local_178.data._M_elems[5];
    local_138.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
    local_138.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
    local_138.exp = local_178.exp;
    local_138.neg = local_178.neg;
    local_138.fpclass = local_178.fpclass;
    local_138.prec_elem = local_178.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_138,&local_68)
    ;
    local_a8.data._M_elems[0] = local_138.data._M_elems[0];
    local_a8.data._M_elems[1] = local_138.data._M_elems[1];
    local_a8.data._M_elems[2] = local_138.data._M_elems[2];
    local_a8.data._M_elems[3] = local_138.data._M_elems[3];
    local_a8.data._M_elems[4] = local_138.data._M_elems[4];
    local_a8.data._M_elems[5] = local_138.data._M_elems[5];
    local_a8.data._M_elems[6] = local_138.data._M_elems[6];
    local_a8.data._M_elems[7] = local_138.data._M_elems[7];
    local_a8.data._M_elems[8] = local_138.data._M_elems[8];
    local_a8.data._M_elems[9] = local_138.data._M_elems[9];
    local_a8.exp = local_138.exp;
    local_a8.neg = local_138.neg;
    local_a8.fpclass = local_138.fpclass;
    local_a8.prec_elem = local_138.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_a8,&local_68);
    pUVar5 = ((this->
              super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thesolver)->theFvec;
    lVar8 = (long)(pUVar5->thedelta).super_IdxSet.num;
    if (0 < lVar8) {
      lVar8 = lVar8 + 1;
      do {
        iVar3 = (pUVar5->thedelta).super_IdxSet.idx[lVar8 + -2];
        pcVar1 = &local_f0[iVar3].m_backend;
        local_178.fpclass = cpp_dec_float_finite;
        local_178.prec_elem = 10;
        local_178.data._M_elems[0] = 0;
        local_178.data._M_elems[1] = 0;
        local_178.data._M_elems[2] = 0;
        local_178.data._M_elems[3] = 0;
        local_178.data._M_elems[4] = 0;
        local_178.data._M_elems[5] = 0;
        local_178.data._M_elems._24_5_ = 0;
        local_178.data._M_elems[7]._1_3_ = 0;
        local_178.data._M_elems._32_5_ = 0;
        local_178.data._M_elems[9]._1_3_ = 0;
        local_178.exp = 0;
        local_178.neg = false;
        if (&local_178 != pcVar1) {
          uVar6 = *(undefined8 *)((pcVar1->data)._M_elems + 8);
          local_178.data._M_elems._32_5_ = SUB85(uVar6,0);
          local_178.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_178.data._M_elems._0_8_ = *(undefined8 *)(pcVar1->data)._M_elems;
          local_178.data._M_elems._8_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 2);
          local_178.data._M_elems._16_8_ = *(undefined8 *)((pcVar1->data)._M_elems + 4);
          uVar6 = *(undefined8 *)((pcVar1->data)._M_elems + 6);
          local_178.data._M_elems._24_5_ = SUB85(uVar6,0);
          local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
          local_178.exp = pcVar1->exp;
          local_178.neg = pcVar1->neg;
          local_178.fpclass = pcVar1->fpclass;
          local_178.prec_elem = pcVar1->prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_178,pcVar1);
        local_138.data._M_elems[9]._1_3_ = local_178.data._M_elems[9]._1_3_;
        local_138.data._M_elems._32_5_ = local_178.data._M_elems._32_5_;
        local_138.data._M_elems[7]._1_3_ = local_178.data._M_elems[7]._1_3_;
        local_138.data._M_elems._24_5_ = local_178.data._M_elems._24_5_;
        local_138.data._M_elems[4] = local_178.data._M_elems[4];
        local_138.data._M_elems[5] = local_178.data._M_elems[5];
        local_138.data._M_elems[0] = local_178.data._M_elems[0];
        local_138.data._M_elems[1] = local_178.data._M_elems[1];
        local_138.data._M_elems[2] = local_178.data._M_elems[2];
        local_138.data._M_elems[3] = local_178.data._M_elems[3];
        local_138.exp = local_178.exp;
        local_138.neg = local_178.neg;
        local_138.fpclass = local_178.fpclass;
        local_138.prec_elem = local_178.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&local_138,&local_a8);
        local_e8.data._M_elems[0] = local_138.data._M_elems[0];
        local_e8.data._M_elems[1] = local_138.data._M_elems[1];
        local_e8.data._M_elems[2] = local_138.data._M_elems[2];
        local_e8.data._M_elems[3] = local_138.data._M_elems[3];
        local_e8.data._M_elems[4] = local_138.data._M_elems[4];
        local_e8.data._M_elems[5] = local_138.data._M_elems[5];
        local_e8.data._M_elems._24_5_ = local_138.data._M_elems._24_5_;
        local_e8.data._M_elems[7]._1_3_ = local_138.data._M_elems[7]._1_3_;
        local_e8.data._M_elems._32_5_ = local_138.data._M_elems._32_5_;
        local_e8.data._M_elems[9]._1_3_ = local_138.data._M_elems[9]._1_3_;
        local_e8.exp = local_138.exp;
        local_e8.neg = local_138.neg;
        local_e8.fpclass = local_138.fpclass;
        local_e8.prec_elem = local_138.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                  (&(pSVar4->coWeights).val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend,&local_e8);
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    pnVar7 = (pSVar4->coWeights).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)((long)&(pnVar7->m_backend).data + local_f8 + 0x20) =
         local_a8.data._M_elems._32_8_;
    puVar2 = (uint *)((long)&(pnVar7->m_backend).data + local_f8 + 0x10);
    *(undefined8 *)puVar2 = local_a8.data._M_elems._16_8_;
    *(undefined8 *)(puVar2 + 2) = local_a8.data._M_elems._24_8_;
    puVar2 = (uint *)((long)&(pnVar7->m_backend).data + local_f8);
    *(undefined8 *)puVar2 = local_a8.data._M_elems._0_8_;
    *(undefined8 *)(puVar2 + 2) = local_a8.data._M_elems._8_8_;
    *(int *)((long)&(pnVar7->m_backend).data + local_f8 + 0x28) = local_a8.exp;
    *(bool *)((long)&(pnVar7->m_backend).data + local_f8 + 0x2c) = local_a8.neg;
    *(undefined8 *)((long)&(pnVar7->m_backend).data + local_f8 + 0x30) = local_a8._48_8_;
  }
  return;
}

Assistant:

inline bool isValid() const
   {
      return info != 0;
   }